

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

void do_assassinate(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CClass *this;
  CHAR_DATA *victim;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  char arg [4608];
  char buf [4608];
  
  one_argument(argument,arg);
  bVar2 = is_npc(ch);
  if (bVar2) {
    return;
  }
  iVar3 = get_skill(ch,(int)gsn_assassinate);
  if (iVar3 != 0) {
    sVar1 = ch->level;
    lVar9 = (long)gsn_assassinate;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar3 = CClass::GetIndex(this);
    if (*(short *)(lVar9 * 0x60 + 0x45a788 + (long)iVar3 * 2) <= sVar1) {
      if (arg[0] == '\0') {
        pcVar8 = "Attempt to assassinate who?\n\r";
      }
      else {
        victim = get_char_room(ch,arg);
        if (victim == (CHAR_DATA *)0x0) {
          pcVar8 = "They aren\'t here.\n\r";
        }
        else if (victim == ch) {
          pcVar8 = "You can\'t do that.\n\r";
        }
        else if ((victim->fighting == (CHAR_DATA *)0x0) && (victim->position != 7)) {
          bVar2 = is_safe_new(ch,victim,true);
          if (bVar2) {
            return;
          }
          bVar2 = check_blade_barrier(ch,victim);
          if (bVar2) {
            return;
          }
          if (victim->max_hit + -0x32 <= victim->hit) {
            iVar3 = get_skill(ch,(int)gsn_assassinate);
            iVar4 = number_percent();
            if (iVar3 < iVar4) {
              pcVar8 = pers(ch,victim);
              sprintf(buf,"Help! %s just tried to assassinate me!",pcVar8);
              do_myell(victim,buf,ch);
              damage_new(ch,victim,0,(int)gsn_assassinate,0x10,true,true,0,1,(char *)0x0);
              check_improve(ch,(int)gsn_assassinate,true,1);
            }
            else {
              uVar10 = ch->level * 3 + (iVar3 * 2) / 3 + victim->level * -4;
              bVar2 = can_see(victim,ch);
              uVar6 = uVar10 + 10;
              if (bVar2) {
                uVar6 = uVar10;
              }
              uVar7 = (ulong)uVar6;
              if (victim->position == 4) {
                uVar7 = (ulong)(uVar6 + 10);
              }
              else if (victim->position == 7) {
                uVar7 = (ulong)(uVar6 - 10);
              }
              uVar10 = (int)(uVar7 >> 0x1f) + (int)uVar7 >> 1;
              uVar6 = 0x19;
              if ((int)uVar10 < 0x19) {
                uVar6 = uVar10;
              }
              uVar10 = 2;
              if (2 < (int)uVar6) {
                uVar10 = uVar6;
              }
              if (ch->level + 8 < (int)victim->level) {
                uVar10 = 0;
              }
              uVar6 = 5;
              if (uVar10 < 7) {
                uVar6 = uVar10;
              }
              act("$n tries to strike at $N\'s critical nerves!",ch,(void *)0x0,victim,1);
              act("You try to strike $N\'s critical nerves!",ch,(void *)0x0,victim,3);
              uVar10 = 100;
              if (ch->level != 0x3c) {
                uVar10 = uVar6;
              }
              iVar3 = number_percent();
              if (iVar3 < (int)uVar10) {
                act("$n +++ ASSASSINATES +++ $N!",ch,(void *)0x0,victim,1);
                act("You +++ ASSASSINATE +++ $N!",ch,(void *)0x0,victim,3);
                act_new("$n +++ ASSASSINATES +++ you!",ch,(void *)0x0,victim,2,0);
                raw_kill(ch,victim);
                check_improve(ch,(int)gsn_assassinate,true,3);
                return;
              }
              iVar3 = ch->damroll * 2;
              iVar4 = number_percent();
              iVar5 = get_skill(ch,(int)gsn_enhanced_damage);
              if (iVar4 < iVar5) {
                iVar4 = number_percent();
                iVar3 = (iVar4 * iVar3) / 100 + iVar3;
              }
              damage_new(ch,victim,iVar3,(int)gsn_assassinate,0xb,true,true,0,1,(char *)0x0);
              check_improve(ch,(int)gsn_assassinate,false,1);
              bVar2 = is_npc(victim);
              if (((!bVar2) && (bVar2 = is_npc(ch), !bVar2)) && (victim->ghost == 0)) {
                pcVar8 = pers(ch,victim);
                sprintf(buf,"Help! %s just tried to assassinate me!",pcVar8);
                do_myell(victim,buf,ch);
              }
              multi_hit(victim,ch,-1);
            }
            WAIT_STATE(ch,0x18);
            return;
          }
          pcVar8 = "They have too much blood on them right now to locate their strike point.\n\r";
        }
        else {
          pcVar8 = "They are moving around too much to get in close for the kill.\n\r";
        }
      }
      goto LAB_0029ee74;
    }
  }
  pcVar8 = "Huh?\n\r";
LAB_0029ee74:
  send_to_char(pcVar8,ch);
  return;
}

Assistant:

void do_assassinate(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	int chance, dam;
	char arg[MAX_INPUT_LENGTH];
	char buf[MAX_INPUT_LENGTH];

	one_argument(argument, arg);

	if (is_npc(ch))
		return;

	if (get_skill(ch, gsn_assassinate) == 0 ||
		ch->level < skill_table[gsn_assassinate].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		send_to_char("Attempt to assassinate who?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You can't do that.\n\r", ch);
		return;
	}

	if (victim->fighting != nullptr || victim->position == POS_FIGHTING)
	{
		send_to_char("They are moving around too much to get in close for the kill.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (check_blade_barrier(ch, victim))
		return;

	if (victim->hit < victim->max_hit - 50)
	{
		send_to_char("They have too much blood on them right now to locate their strike point.\n\r", ch);
		return;
	}

	chance = get_skill(ch, gsn_assassinate);

	if (number_percent() > chance)
	{
		sprintf(buf, "Help! %s just tried to assassinate me!", pers(ch, victim));
		do_myell(victim, buf, ch);
		damage_old(ch, victim, 0, gsn_assassinate, DAM_OTHER, true);
		check_improve(ch, gsn_assassinate, 1, true);
		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return;
	}

	chance *= 2;
	chance /= 3;
	chance += (ch->level * 3);
	chance -= (victim->level * 4);

	if (!can_see(victim, ch))
		chance += 10;

	if (victim->position == POS_FIGHTING)
		chance -= 10;
	else if (victim->position == POS_SLEEPING)
		chance += 10;

	chance /= 2;
	chance = URANGE(2, chance, 25);

	if (victim->level > (ch->level + 8))
		chance = 0;

	if (chance > 6)
		chance = 5;

	act("$n tries to strike at $N's critical nerves!", ch, 0, victim, TO_NOTVICT);
	act("You try to strike $N's critical nerves!", ch, 0, victim, TO_CHAR);

	/*        act("$n strikes at your critical nerves!",ch,0,victim,TO_VICT); */

	if (ch->level == MAX_LEVEL)
	{
		chance = 100;
	}

	if (number_percent() < chance)
	{
		act("$n +++ ASSASSINATES +++ $N!", ch, 0, victim, TO_NOTVICT);
		act("You +++ ASSASSINATE +++ $N!", ch, 0, victim, TO_CHAR);
		act_new("$n +++ ASSASSINATES +++ you!", ch, 0, victim, TO_VICT, POS_DEAD);
		raw_kill(ch, victim);
		check_improve(ch, gsn_assassinate, true, 3);
		return;
	}
	else
	{
		dam = ch->damroll * 2;

		if (number_percent() < get_skill(ch, gsn_enhanced_damage))
		{
			dam += (number_percent() * dam / 100);
		}

		damage_old(ch, victim, dam, gsn_assassinate, DAM_ENERGY, true);
		check_improve(ch, gsn_assassinate, false, 1);

		if (!is_npc(victim) && !is_npc(ch) && (victim->ghost == 0))
		{
			sprintf(buf, "Help! %s just tried to assassinate me!", pers(ch, victim));
			do_myell(victim, buf, ch);
		}

		multi_hit(victim, ch, TYPE_UNDEFINED);
		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
	}
}